

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

SizeRange * __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::mutable_heightrange
          (ImageFeatureType_ImageSizeRange *this)

{
  SizeRange *this_00;
  
  this_00 = this->heightrange_;
  if (this_00 == (SizeRange *)0x0) {
    this_00 = (SizeRange *)operator_new(0x28);
    SizeRange::SizeRange(this_00);
    this->heightrange_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SizeRange* ImageFeatureType_ImageSizeRange::mutable_heightrange() {
  
  if (heightrange_ == NULL) {
    heightrange_ = new ::CoreML::Specification::SizeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ImageFeatureType.ImageSizeRange.heightRange)
  return heightrange_;
}